

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanLogicalDevice::ReleaseVulkanObject
          (VulkanLogicalDevice *this,AccelStructWrapper *AccelStruct)

{
  AccelStructWrapper *AccelStruct_local;
  VulkanLogicalDevice *this_local;
  
  (*vkDestroyAccelerationStructureKHR)(this->m_VkDevice,AccelStruct->m_VkObject,this->m_VkAllocator)
  ;
  AccelStruct->m_VkObject = (VkAccelerationStructureKHR_T *)0x0;
  return;
}

Assistant:

void VulkanLogicalDevice::ReleaseVulkanObject(AccelStructWrapper&& AccelStruct) const
{
#if DILIGENT_USE_VOLK
    vkDestroyAccelerationStructureKHR(m_VkDevice, AccelStruct.m_VkObject, m_VkAllocator);
    AccelStruct.m_VkObject = VK_NULL_HANDLE;
#else
    UNSUPPORTED("vkDestroyAccelerationStructureKHR is only available through Volk");
#endif
}